

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O0

ProductionPtr __thiscall
avro::parsing::ResolvingGrammarGenerator::resolveRecords
          (ResolvingGrammarGenerator *this,NodePtr *writer,NodePtr *reader,
          map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m,map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             *m2)

{
  bool bVar1;
  Type TVar2;
  type pNVar3;
  pointer ppVar4;
  size_type sVar5;
  type this_00;
  pointer ppVar6;
  type this_01;
  iterator __first;
  type pvVar7;
  shared_ptr<avro::Node> *in_RCX;
  shared_ptr<avro::Node> *in_RDX;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar8;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *in_RDI;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *in_R8;
  ProductionPtr PVar9;
  ProductionPtr p_2;
  const_iterator it2_1;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> defaultBinary;
  NodePtr s;
  const_iterator it_1;
  ProductionPtr p_1;
  map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *in_stack_00000298;
  map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *in_stack_000002a0;
  ProductionPtr p;
  ResolvingGrammarGenerator *in_stack_000002b8;
  iterator it2;
  const_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fieldOrder;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  rf;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  wf;
  ProductionPtr *result;
  value_type *in_stack_fffffffffffffc78;
  pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_> *in_stack_fffffffffffffc80;
  __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  in_stack_fffffffffffffc88;
  __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  in_stack_fffffffffffffc90;
  const_iterator in_stack_fffffffffffffc98;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  in_stack_fffffffffffffca0;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *this_02;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  in_stack_fffffffffffffca8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcb0;
  back_insert_iterator<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  in_stack_fffffffffffffcb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcc8;
  type in_stack_fffffffffffffcd0;
  NodePtr *in_stack_fffffffffffffce8;
  NodePtr *in_stack_fffffffffffffcf0;
  type in_stack_fffffffffffffcf8;
  iterator local_1f8;
  _Rb_tree_const_iterator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  local_1f0;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1e8 [3];
  iterator local_1b8;
  _Rb_tree_const_iterator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  local_1b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8 [2];
  shared_ptr<avro::Node> local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_150;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_148 [5];
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_120;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_110;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *local_100;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *local_f8;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_d0;
  equalsFirst<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_b8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_a0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_98 [12];
  byte local_31;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *local_28;
  shared_ptr<avro::Node> *local_20;
  shared_ptr<avro::Node> *local_18;
  
  local_31 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  fields_abi_cxx11_(in_stack_fffffffffffffce8);
  fields_abi_cxx11_(in_stack_fffffffffffffce8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1dc102);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_20);
  (*pNVar3->_vptr_Node[7])();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_fffffffffffffcb0,(size_type)in_stack_fffffffffffffca8._M_current);
  local_a0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffc78);
  __gnu_cxx::
  __normal_iterator<std::pair<std::__cxx11::string,unsigned_long>const*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>
  ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*>
            ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffc80,
             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffc78);
  while( true ) {
    local_a8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffc78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    local_b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_fffffffffffffc78);
    local_c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffc78);
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
             ::operator->(local_98);
    equalsFirst<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::equalsFirst(&local_c8,&ppVar6->first);
    local_b0 = std::
               find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,avro::parsing::equalsFirst<std::__cxx11::string,unsigned_long>>
                         (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                          in_stack_fffffffffffffc98._M_current);
    local_d0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffc78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffc78);
    if (bVar1) {
      pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_18);
      ppVar6 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
               ::operator->(local_98);
      (*pNVar3->_vptr_Node[5])(pNVar3,(ulong)(uint)ppVar6->second);
      pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_20);
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
               ::operator->(&local_b0);
      (*pNVar3->_vptr_Node[5])(pNVar3,(ulong)(uint)ppVar4->second);
      doGenerate2(in_stack_000002b8,(NodePtr *)p.pn.pi_,(NodePtr *)p.px,in_stack_000002a0,
                  in_stack_00000298);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator->(&local_e0);
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::rbegin
                ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 in_stack_fffffffffffffc88._M_current);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator->(&local_e0);
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::rend
                ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 in_stack_fffffffffffffc88._M_current);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator*(in_RDI);
      local_f8 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 std::
                 back_inserter<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                           ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *
                            )in_stack_fffffffffffffc78);
      local_100 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                  std::
                  copy<std::reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>,std::back_insert_iterator<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                            ((reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
                              *)in_stack_fffffffffffffcb0,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
                              *)in_stack_fffffffffffffca8._M_current,in_stack_fffffffffffffcb8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
      ::operator->(&local_b0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffc90._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffffc88._M_current);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::string,unsigned_long>const*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>
      ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*>
                ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                  *)in_stack_fffffffffffffc80,
                 (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                  *)in_stack_fffffffffffffc78);
      local_110 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                   *)std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::erase((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              *)in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc98);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x1dc427);
    }
    else {
      pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_18);
      ppVar6 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
               ::operator->(local_98);
      (*pNVar3->_vptr_Node[5])(pNVar3,(ulong)(uint)ppVar6->second);
      getWriterProduction((ResolvingGrammarGenerator *)in_stack_fffffffffffffcf8,
                          in_stack_fffffffffffffcf0,
                          (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                           *)in_stack_fffffffffffffce8);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator->(in_RDI);
      Symbol::skipStart();
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      Symbol::~Symbol((Symbol *)0x1dc54c);
      pvVar7 = boost::
               shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               ::operator->(&local_120);
      sVar5 = std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::size
                        (pvVar7);
      if (sVar5 == 1) {
        boost::
        shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
        operator->(in_RDI);
        this_00 = boost::
                  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                  ::operator*(&local_120);
        std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::operator[]
                  (this_00,0);
        std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                   in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc88._M_current);
      }
      else {
        in_stack_fffffffffffffcf8 =
             boost::
             shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             ::operator->(in_RDI);
        Symbol::indirect((ProductionPtr *)in_stack_fffffffffffffca8._M_current);
        std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                   in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        Symbol::~Symbol((Symbol *)0x1dc63f);
      }
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x1dc671);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
    ::operator++(local_98);
  }
  local_150 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          *)in_stack_fffffffffffffc78);
  __gnu_cxx::
  __normal_iterator<std::pair<std::__cxx11::string,unsigned_long>const*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>
  ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*>
            ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffc80,
             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffc78);
  while( true ) {
    local_158 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          *)in_stack_fffffffffffffc78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(local_20);
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
             ::operator->(local_148);
    (*pNVar3->_vptr_Node[5])(pNVar3,(ulong)(uint)ppVar6->second);
    boost::shared_ptr<avro::Node>::shared_ptr
              (&in_stack_fffffffffffffc80->first,(shared_ptr<avro::Node> *)in_stack_fffffffffffffc78
              );
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
    ::operator->(local_148);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffc90._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffffc88._M_current);
    this_01 = boost::shared_ptr<avro::Node>::operator->(&local_168);
    TVar2 = Node::type(this_01);
    if (TVar2 == AVRO_NUM_TYPES) {
      resolveSymbol((NodePtr *)pNVar3);
      boost::shared_ptr<avro::Node>::operator=
                ((shared_ptr<avro::Node> *)in_stack_fffffffffffffc90._M_current,
                 (shared_ptr<avro::Node> *)in_stack_fffffffffffffc88._M_current);
      boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dc7bf);
    }
    in_stack_fffffffffffffcd0 = boost::shared_ptr<avro::Node>::operator->(local_20);
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
             ::operator->(local_148);
    (*in_stack_fffffffffffffcd0->_vptr_Node[6])
              (in_stack_fffffffffffffcd0,(ulong)(uint)ppVar6->second);
    getAvroBinary((GenericDatum *)in_stack_fffffffffffffcb8.container);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    in_stack_fffffffffffffcc8 = local_1a8;
    boost::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffc80,
               (shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffc78);
    Symbol::defaultStartAction
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffca8._M_current);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    Symbol::~Symbol((Symbol *)0x1dc886);
    boost::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x1dc893);
    in_stack_fffffffffffffcb8.container = local_28;
    std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>::
    pair<boost::shared_ptr<avro::Node>_&,_boost::shared_ptr<avro::Node>_&,_true>
              ((pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_> *)
               in_stack_fffffffffffffc90._M_current,
               (shared_ptr<avro::Node> *)in_stack_fffffffffffffc88._M_current,
               &in_stack_fffffffffffffc80->first);
    __first = std::
              map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              ::find((map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                      *)in_stack_fffffffffffffc78,(key_type *)0x1dc8cc);
    local_1b8._M_node = __first._M_node;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::_Rb_tree_const_iterator(&local_1b0,&local_1b8);
    std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>::~pair
              (in_stack_fffffffffffffc80);
    local_1f8._M_node =
         (_Base_ptr)
         std::
         map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
         ::end((map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                *)in_stack_fffffffffffffc78);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::_Rb_tree_const_iterator(&local_1f0,&local_1f8);
    bVar1 = std::operator==(&local_1b0,&local_1f0);
    if (bVar1) {
      doGenerate2(in_stack_000002b8,(NodePtr *)p.pn.pi_,(NodePtr *)p.px,in_stack_000002a0,
                  in_stack_00000298);
    }
    else {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                    *)0x1dc988);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)in_stack_fffffffffffffc80,
                   (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)in_stack_fffffffffffffc78);
    }
    this_02 = local_1e8;
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(this_02);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::rbegin
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffc88._M_current);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(this_02);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::rend
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffc88._M_current);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator*(in_RDI);
    in_stack_fffffffffffffca8._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          *)std::
            back_inserter<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                      ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                       in_stack_fffffffffffffc78);
    std::
    copy<std::reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>,std::back_insert_iterator<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
                *)__first._M_node,
               (reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
                *)in_stack_fffffffffffffca8._M_current,in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffc90._M_current =
         (Symbol *)
         boost::
         shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
         operator->(in_RDI);
    Symbol::defaultEndAction();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    Symbol::~Symbol((Symbol *)0x1dca74);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x1dca81);
    boost::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x1dca8e);
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dca9b);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
    ::operator++(local_148);
  }
  boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
  operator->(in_RDI);
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::begin
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             in_stack_fffffffffffffc78);
  boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
  operator->(in_RDI);
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::end
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             in_stack_fffffffffffffc78);
  std::
  reverse<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
  operator->(in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcc8);
  Symbol::sizeListAction
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffcb8.container);
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Symbol::~Symbol((Symbol *)0x1dcc41);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc90._M_current);
  pvVar7 = boost::
           shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
           operator->(in_RDI);
  Symbol::recordAction();
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
            (pvVar7,in_stack_fffffffffffffc78);
  Symbol::~Symbol((Symbol *)0x1dcc90);
  local_31 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc90._M_current);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             *)in_stack_fffffffffffffc90._M_current);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             *)in_stack_fffffffffffffc90._M_current);
  sVar8.pi_ = extraout_RDX;
  if ((local_31 & 1) == 0) {
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x1dcd6f);
    sVar8.pi_ = extraout_RDX_00;
  }
  PVar9.pn.pi_ = sVar8.pi_;
  PVar9.px = (element_type *)in_RDI;
  return PVar9;
}

Assistant:

ProductionPtr ResolvingGrammarGenerator::resolveRecords(
    const NodePtr& writer, const NodePtr& reader,
    map<NodePair, ProductionPtr>& m,
    map<NodePtr, ProductionPtr>& m2)
{
    ProductionPtr result = make_shared<Production>();

    vector<pair<string, size_t> > wf = fields(writer);
    vector<pair<string, size_t> > rf = fields(reader);
    vector<size_t> fieldOrder;
    fieldOrder.reserve(reader->names());

    /*
     * We look for all writer fields in the reader. If found, recursively
     * resolve the corresponding fields. Then erase the reader field.
     * If no matching field is found for reader, arrange to skip the writer
     * field.
     */
    for (vector<pair<string, size_t> >::const_iterator it = wf.begin();
        it != wf.end(); ++it) {
        vector<pair<string, size_t> >::iterator it2 =
            find_if(rf.begin(), rf.end(),
                equalsFirst<string, size_t>(it->first));
        if (it2 != rf.end()) {
            ProductionPtr p = doGenerate2(writer->leafAt(it->second),
                reader->leafAt(it2->second), m, m2);
            copy(p->rbegin(), p->rend(), back_inserter(*result));
            fieldOrder.push_back(it2->second);
            rf.erase(it2);
        } else {
            ProductionPtr p = getWriterProduction(
                writer->leafAt(it->second), m2);
            result->push_back(Symbol::skipStart());
            if (p->size() == 1) {
                result->push_back((*p)[0]);
            } else {
                result->push_back(Symbol::indirect(p));
            }
        }
    }

    /*
     * Examine the reader fields left out, (i.e. those didn't have corresponding
     * writer field).
     */
    for (vector<pair<string, size_t> >::const_iterator it = rf.begin();
        it != rf.end(); ++it) {

        NodePtr s = reader->leafAt(it->second);
        fieldOrder.push_back(it->second);

        if (s->type() == AVRO_SYMBOLIC) {
            s = resolveSymbol(s);
        }
        shared_ptr<vector<uint8_t> > defaultBinary =
            getAvroBinary(reader->defaultValueAt(it->second));
        result->push_back(Symbol::defaultStartAction(defaultBinary));
        map<NodePair, shared_ptr<Production> >::const_iterator it2 =
            m.find(NodePair(s, s));
        ProductionPtr p = (it2 == m.end()) ?
            doGenerate2(s, s, m, m2) : it2->second;
        copy(p->rbegin(), p->rend(), back_inserter(*result));
        result->push_back(Symbol::defaultEndAction());
    }
    reverse(result->begin(), result->end());
    result->push_back(Symbol::sizeListAction(fieldOrder));
    result->push_back(Symbol::recordAction());

    return result;

}